

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O0

void __thiscall display::test_method(display *this)

{
  undefined8 uVar1;
  bool bVar2;
  string *psVar3;
  long *plVar4;
  lazy_ostream *prev;
  basic_cstring<const_char> local_268;
  basic_cstring<const_char> local_258;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_248;
  basic_cstring<const_char> local_228;
  assertion_result local_218;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  basic_cstring<const_char> local_1e0;
  output_test_stream local_1d0 [8];
  output_test_stream output;
  allocator<char> local_39;
  string local_38 [32];
  long *local_18;
  Entity *entity;
  display *this_local;
  
  entity = (Entity *)this;
  psVar3 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"my-entity",&local_39);
  plVar4 = (long *)dynamicgraph::PoolStorage::getEntity(psVar3);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = plVar4;
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1e0);
  boost::test_tools::output_test_stream::output_test_stream(local_1d0,&local_1e0,1);
  (**(code **)(*local_18 + 0x30))(local_18,local_1d0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_200);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f0,0xb1,&local_200);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_228,"CustomEntity: my-entity")
    ;
    boost::test_tools::output_test_stream::is_equal(&local_218,local_1d0,&local_228,1);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_258,"output.is_equal(\"CustomEntity: my-entity\")",0x2a);
    boost::unit_test::operator<<(&local_248,prev,&local_258);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
               ,0x61);
    boost::test_tools::tt_detail::report_assertion(&local_218,&local_248,&local_268,0xb1,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_248);
    boost::test_tools::assertion_result::~assertion_result(&local_218);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::test_tools::output_test_stream::~output_test_stream(local_1d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(display) {
  dynamicgraph::Entity &entity =
      dynamicgraph::PoolStorage::getInstance()->getEntity("my-entity");

  output_test_stream output;

  entity.display(output);
  BOOST_CHECK(output.is_equal("CustomEntity: my-entity"));
}